

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.cpp
# Opt level: O0

int no_err(int val,char *msg)

{
  Error *this;
  undefined8 uVar1;
  char *msg_local;
  int val_local;
  
  if (val < 0) {
    this = (Error *)__cxa_allocate_exception(0x3f0);
    from_errno_abi_cxx11_();
    uVar1 = std::__cxx11::string::c_str();
    Error::Error(this,"%s, %s\n",uVar1,msg);
    __cxa_throw(this,&Error::typeinfo,Error::~Error);
  }
  return val;
}

Assistant:

int no_err(int val, const char *msg) {
  if (val < 0) {
    throw Error("%s, %s\n", from_errno().c_str(), msg);
  }
  return val;
}